

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS ref_gather_plt_brick_header(REF_GRID ref_grid,REF_CELL ref_cell,FILE *file)

{
  REF_MPI pRVar1;
  uint uVar2;
  size_t sVar3;
  undefined8 uVar4;
  char *pcVar5;
  size_t sStackY_590;
  int celldim;
  int aux;
  int numelements;
  int numpts;
  int faceneighbors;
  int varloc;
  int datapacking;
  int zonetype;
  int notused;
  int strandid;
  int parentzone;
  float zonemarker;
  int len;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  REF_LONG ncell;
  double solutiontime;
  char zonename [256];
  int ascii [256];
  
  pRVar1 = ref_grid->mpi;
  parentzone = -1;
  strandid = -1;
  solutiontime = 0.0;
  notused = -1;
  datapacking = 0;
  varloc = 0;
  faceneighbors = 0;
  zonemarker = 299.0;
  celldim = 0;
  aux = 0;
  zonetype = 5;
  uVar2 = ref_grid_compact_cell_nodes(ref_grid,ref_cell,&nnode,&ncell,&l2c);
  if (uVar2 != 0) {
    pcVar5 = "l2c";
    uVar4 = 0xeff;
LAB_00176520:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar4,
           "ref_gather_plt_brick_header",(ulong)uVar2,pcVar5);
    return uVar2;
  }
  if (0 < ncell && 0 < nnode) {
    if ((ulong)nnode >> 0x1f == 0) {
      numpts = (int)nnode;
      if ((ulong)ncell < 0x80000000) {
        numelements = (int)ncell;
        if (pRVar1->id == 0) {
          sVar3 = fwrite(&zonemarker,4,1,(FILE *)file);
          if (sVar3 == 1) {
            snprintf(zonename,0x100,"brick%d",(ulong)(uint)ref_cell->node_per);
            uVar2 = ref_gather_plt_char_int(zonename,0x100,&len,ascii);
            if (uVar2 != 0) {
              pcVar5 = "a2i";
              uVar4 = 0xf0e;
              goto LAB_00176520;
            }
            sStackY_590 = (size_t)len;
            sVar3 = fwrite(ascii,4,sStackY_590,(FILE *)file);
            if (sVar3 == sStackY_590) {
              sVar3 = fwrite(&parentzone,4,1,(FILE *)file);
              if (sVar3 == 1) {
                sVar3 = fwrite(&strandid,4,1,(FILE *)file);
                if (sVar3 == 1) {
                  sVar3 = fwrite(&solutiontime,8,1,(FILE *)file);
                  if (sVar3 == 1) {
                    sVar3 = fwrite(&notused,4,1,(FILE *)file);
                    if (sVar3 == 1) {
                      sVar3 = fwrite(&zonetype,4,1,(FILE *)file);
                      if (sVar3 == 1) {
                        sVar3 = fwrite(&datapacking,4,1,(FILE *)file);
                        if (sVar3 == 1) {
                          sVar3 = fwrite(&varloc,4,1,(FILE *)file);
                          if (sVar3 == 1) {
                            sVar3 = fwrite(&faceneighbors,4,1,(FILE *)file);
                            if (sVar3 == 1) {
                              sVar3 = fwrite(&numpts,4,1,(FILE *)file);
                              if (sVar3 == 1) {
                                sVar3 = fwrite(&numelements,4,1,(FILE *)file);
                                if (sVar3 == 1) {
                                  sVar3 = fwrite(&celldim,4,1,(FILE *)file);
                                  if (sVar3 == 1) {
                                    sVar3 = fwrite(&celldim,4,1,(FILE *)file);
                                    if (sVar3 == 1) {
                                      sVar3 = fwrite(&celldim,4,1,(FILE *)file);
                                      if (sVar3 == 1) {
                                        sVar3 = fwrite(&aux,4,1,(FILE *)file);
                                        if (sVar3 == 1) goto LAB_0017654f;
                                        pcVar5 = "int";
                                        sStackY_590 = 1;
                                        uVar4 = 0xf1e;
                                      }
                                      else {
                                        pcVar5 = "int";
                                        sStackY_590 = 1;
                                        uVar4 = 0xf1d;
                                      }
                                    }
                                    else {
                                      pcVar5 = "int";
                                      sStackY_590 = 1;
                                      uVar4 = 0xf1c;
                                    }
                                  }
                                  else {
                                    pcVar5 = "int";
                                    sStackY_590 = 1;
                                    uVar4 = 0xf1b;
                                  }
                                }
                                else {
                                  pcVar5 = "int";
                                  sStackY_590 = 1;
                                  uVar4 = 0xf1a;
                                }
                              }
                              else {
                                pcVar5 = "int";
                                sStackY_590 = 1;
                                uVar4 = 0xf19;
                              }
                            }
                            else {
                              pcVar5 = "int";
                              sStackY_590 = 1;
                              uVar4 = 0xf18;
                            }
                          }
                          else {
                            pcVar5 = "int";
                            sStackY_590 = 1;
                            uVar4 = 0xf17;
                          }
                        }
                        else {
                          pcVar5 = "int";
                          sStackY_590 = 1;
                          uVar4 = 0xf16;
                        }
                      }
                      else {
                        pcVar5 = "int";
                        sStackY_590 = 1;
                        uVar4 = 0xf15;
                      }
                    }
                    else {
                      pcVar5 = "int";
                      sStackY_590 = 1;
                      uVar4 = 0xf14;
                    }
                  }
                  else {
                    pcVar5 = "double";
                    sStackY_590 = 1;
                    uVar4 = 0xf13;
                  }
                }
                else {
                  pcVar5 = "int";
                  sStackY_590 = 1;
                  uVar4 = 0xf12;
                }
              }
              else {
                pcVar5 = "int";
                sStackY_590 = 1;
                uVar4 = 0xf11;
              }
            }
            else {
              pcVar5 = "title";
              uVar4 = 0xf0f;
            }
          }
          else {
            pcVar5 = "zonemarker";
            sStackY_590 = 1;
            uVar4 = 0xf0b;
          }
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar4,"ref_gather_plt_brick_header",pcVar5,sStackY_590,sVar3);
          return 1;
        }
        goto LAB_0017654f;
      }
      pcVar5 = "too many bricks for int";
      uVar4 = 0xf07;
    }
    else {
      pcVar5 = "too many nodes for int";
      uVar4 = 0xf05;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar4,
           "ref_gather_plt_brick_header",pcVar5);
    return 1;
  }
LAB_0017654f:
  free(l2c);
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_brick_header(REF_GRID ref_grid,
                                                      REF_CELL ref_cell,
                                                      FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  char zonename[256];
  int ascii[256];
  int len;
  float zonemarker = 299.0;
  int parentzone = -1;
  int strandid = -1;
  double solutiontime = 0.0;
  int notused = -1;
  int zonetype;
  int datapacking = 0; /*0=Block, point does not work.*/
  int varloc = 0;      /*0 = Don't specify, all data is located at nodes*/
  int faceneighbors = 0;
  int numpts;
  int numelements;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int celldim = 0;
  int aux = 0;

  zonetype = 5; /*5=FEBRICK*/

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }

  RAS(nnode <= REF_INT_MAX, "too many nodes for int");
  numpts = (int)nnode;
  RAS(ncell <= REF_INT_MAX, "too many bricks for int");
  numelements = (int)ncell;

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    snprintf(zonename, 256, "brick%d", ref_cell_node_per(ref_cell));
    RSS(ref_gather_plt_char_int(zonename, 256, &len, ascii), "a2i");
    REIS(len, fwrite(&ascii, sizeof(int), (unsigned long)len, file), "title");

    REIS(1, fwrite(&parentzone, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&strandid, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&solutiontime, sizeof(double), 1, file), "double");
    REIS(1, fwrite(&notused, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&zonetype, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&datapacking, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varloc, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&faceneighbors, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&numpts, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&numelements, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&aux, sizeof(int), 1, file), "int");
  }

  ref_free(l2c);
  return REF_SUCCESS;
}